

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O1

void update_coeff_general
               (int *accu_rate,int64_t *accu_dist,int si,int eob,TX_SIZE tx_size,TX_CLASS tx_class,
               int bhl,int width,int64_t rdmult,int shift,int dc_sign_ctx,int16_t *dequant,
               int16_t *scan,LV_MAP_COEFF_COST *txb_costs,tran_low_t *tcoeff,tran_low_t *qcoeff,
               tran_low_t *dqcoeff,uint8_t *levels,qm_val_t *iqmatrix,qm_val_t *qmatrix)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  uint8_t uVar6;
  long lVar7;
  int iVar8;
  uint is_last;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint ci;
  int iVar13;
  uint abs_qc;
  byte *pbVar14;
  bool bVar15;
  int local_70;
  ulong local_60;
  
  ci = (uint)scan[si];
  local_70 = (int)dequant[ci != 0];
  if (iqmatrix != (qm_val_t *)0x0) {
    local_70 = (int)((uint)iqmatrix[(int)ci] * local_70 + 0x10) >> 5;
  }
  iVar8 = qcoeff[(int)ci];
  bVar15 = eob + -1 == si;
  bVar4 = (byte)bhl;
  if (bVar15) {
    if (si != 0) {
      iVar10 = width << (bVar4 & 0x1f);
      uVar9 = 1;
      if (iVar10 >> 3 < si) {
        uVar9 = iVar10 >> 2 < si | 2;
      }
      goto LAB_00244e9c;
    }
  }
  else {
    iVar10 = (int)ci >> (bVar4 & 0x1f);
    lVar7 = (long)(int)(ci + iVar10 * 4);
    lVar12 = (long)(1 << (bVar4 & 0x1f));
    iVar13 = (uint)""[levels[lVar7 + 1]] + (uint)""[levels[lVar12 + 4 + lVar7]];
    if (tx_class == '\x02') {
      iVar13 = iVar13 + (uint)""[levels[lVar7 + 3]] + (uint)""[levels[lVar7 + 2]];
      pbVar14 = levels + lVar7 + 4;
    }
    else if (tx_class == '\0') {
      iVar13 = iVar13 + (uint)""[levels[(long)(2 << (bVar4 & 0x1f)) + lVar7 + 8]] +
                        (uint)""[levels[lVar12 + lVar7 + 5]];
      pbVar14 = levels + lVar7 + 2;
    }
    else {
      iVar13 = iVar13 + (uint)""[levels[(long)(3 << (bVar4 & 0x1f)) + lVar7 + 0xc]] +
                        (uint)""[levels[(long)(2 << (bVar4 & 0x1f)) + lVar7 + 8]];
      pbVar14 = levels + (4 << (bVar4 & 0x1f)) + lVar7 + 0x10;
    }
    if (ci != 0 || tx_class != '\0') {
      uVar9 = (uint)""[*pbVar14] + iVar13 + 1 >> 1;
      uVar11 = 4;
      if (uVar9 < 4) {
        uVar11 = uVar9;
      }
      if (tx_class == '\x02') {
        uVar9 = uVar11 + nz_map_ctx_offset_1d[~(-1 << (bVar4 & 0x1f)) & ci];
      }
      else {
        if (tx_class == '\x01') {
          iVar10 = nz_map_ctx_offset_1d[iVar10];
        }
        else {
          uVar9 = 0;
          if (tx_class != '\0') goto LAB_00244e9c;
          iVar10 = (int)av1_nz_map_ctx_offset[tx_size][(int)ci];
        }
        uVar9 = uVar11 + iVar10;
      }
      goto LAB_00244e9c;
    }
  }
  uVar9 = 0;
LAB_00244e9c:
  if (iVar8 == 0) {
    *accu_rate = *accu_rate + txb_costs->base_cost[(int)uVar9][0];
  }
  else {
    iVar10 = -iVar8;
    if (0 < iVar8) {
      iVar10 = iVar8;
    }
    iVar13 = tcoeff[(int)ci];
    bVar5 = (byte)shift;
    lVar7 = (long)(iVar13 - dqcoeff[(int)ci] << (bVar5 & 0x1f));
    if (qmatrix == (qm_val_t *)0x0) {
      uVar2 = lVar7 * lVar7;
    }
    else {
      uVar2 = (ulong)qmatrix[(int)ci] * lVar7 * (ulong)qmatrix[(int)ci] * lVar7 + 0x200 >> 10;
    }
    uVar11 = iVar8 >> 0x1f;
    iVar8 = -uVar11;
    lVar7 = (long)(iVar13 << (bVar5 & 0x1f));
    if (qmatrix == (qm_val_t *)0x0) {
      local_60 = lVar7 * lVar7;
    }
    else {
      local_60 = (ulong)qmatrix[(int)ci] * lVar7 * (ulong)qmatrix[(int)ci] * lVar7 + 0x200 >> 10;
    }
    is_last = (uint)bVar15;
    iVar1 = get_coeff_cost_general
                      (is_last,ci,iVar10,iVar8,uVar9,dc_sign_ctx,txb_costs,bhl,tx_class,levels);
    if (iVar10 == 1) {
      iVar8 = txb_costs->base_cost[(int)uVar9][0];
      iVar13 = 0;
      iVar10 = 0;
      abs_qc = 0;
      uVar3 = local_60;
    }
    else {
      abs_qc = iVar10 - 1;
      iVar10 = ((int)(local_70 * abs_qc) >> (bVar5 & 0x1f) ^ uVar11) + iVar8;
      lVar7 = (long)(iVar13 - iVar10 << (bVar5 & 0x1f));
      if (qmatrix == (qm_val_t *)0x0) {
        uVar3 = lVar7 * lVar7;
      }
      else {
        uVar3 = (ulong)qmatrix[(int)ci] * lVar7 * (ulong)qmatrix[(int)ci] * lVar7 + 0x200 >> 10;
      }
      iVar13 = (abs_qc ^ uVar11) + iVar8;
      iVar8 = get_coeff_cost_general
                        (is_last,ci,abs_qc,iVar8,uVar9,dc_sign_ctx,txb_costs,bhl,tx_class,levels);
    }
    if ((long)(uVar3 * 0x80 + (iVar8 * rdmult + 0x100 >> 9)) <
        (long)(uVar2 * 0x80 + (iVar1 * rdmult + 0x100 >> 9))) {
      qcoeff[(int)ci] = iVar13;
      dqcoeff[(int)ci] = iVar10;
      uVar6 = '\x7f';
      if ((int)abs_qc < 0x7f) {
        uVar6 = (uint8_t)abs_qc;
      }
      levels[(int)(ci + ((int)ci >> (bVar4 & 0x1f)) * 4)] = uVar6;
      uVar2 = uVar3;
      iVar1 = iVar8;
    }
    *accu_rate = *accu_rate + iVar1;
    *accu_dist = *accu_dist + (uVar2 - local_60);
  }
  return;
}

Assistant:

static inline void update_coeff_general(
    int *accu_rate, int64_t *accu_dist, int si, int eob, TX_SIZE tx_size,
    TX_CLASS tx_class, int bhl, int width, int64_t rdmult, int shift,
    int dc_sign_ctx, const int16_t *dequant, const int16_t *scan,
    const LV_MAP_COEFF_COST *txb_costs, const tran_low_t *tcoeff,
    tran_low_t *qcoeff, tran_low_t *dqcoeff, uint8_t *levels,
    const qm_val_t *iqmatrix, const qm_val_t *qmatrix) {
  const int dqv = get_dqv(dequant, scan[si], iqmatrix);
  const int ci = scan[si];
  const tran_low_t qc = qcoeff[ci];
  const int is_last = si == (eob - 1);
  const int coeff_ctx = get_lower_levels_ctx_general(
      is_last, si, bhl, width, levels, ci, tx_size, tx_class);
  if (qc == 0) {
    *accu_rate += txb_costs->base_cost[coeff_ctx][0];
  } else {
    const int sign = (qc < 0) ? 1 : 0;
    const tran_low_t abs_qc = abs(qc);
    const tran_low_t tqc = tcoeff[ci];
    const tran_low_t dqc = dqcoeff[ci];
    const int64_t dist = get_coeff_dist(tqc, dqc, shift, qmatrix, ci);
    const int64_t dist0 = get_coeff_dist(tqc, 0, shift, qmatrix, ci);
    const int rate =
        get_coeff_cost_general(is_last, ci, abs_qc, sign, coeff_ctx,
                               dc_sign_ctx, txb_costs, bhl, tx_class, levels);
    const int64_t rd = RDCOST(rdmult, rate, dist);

    tran_low_t qc_low, dqc_low;
    tran_low_t abs_qc_low;
    int64_t dist_low, rd_low;
    int rate_low;
    if (abs_qc == 1) {
      abs_qc_low = qc_low = dqc_low = 0;
      dist_low = dist0;
      rate_low = txb_costs->base_cost[coeff_ctx][0];
    } else {
      get_qc_dqc_low(abs_qc, sign, dqv, shift, &qc_low, &dqc_low);
      abs_qc_low = abs_qc - 1;
      dist_low = get_coeff_dist(tqc, dqc_low, shift, qmatrix, ci);
      rate_low =
          get_coeff_cost_general(is_last, ci, abs_qc_low, sign, coeff_ctx,
                                 dc_sign_ctx, txb_costs, bhl, tx_class, levels);
    }

    rd_low = RDCOST(rdmult, rate_low, dist_low);
    if (rd_low < rd) {
      qcoeff[ci] = qc_low;
      dqcoeff[ci] = dqc_low;
      levels[get_padded_idx(ci, bhl)] = AOMMIN(abs_qc_low, INT8_MAX);
      *accu_rate += rate_low;
      *accu_dist += dist_low - dist0;
    } else {
      *accu_rate += rate;
      *accu_dist += dist - dist0;
    }
  }
}